

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplaceRealloc<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,pointer pos,
          DefinitionSymbol *args,SourceRange *args_1)

{
  SourceLocation *pSVar1;
  ulong uVar2;
  undefined8 *puVar3;
  SourceLocation SVar4;
  DefinitionSymbol *pDVar5;
  ConfigRule *pCVar6;
  TopCell *__cur_1;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    pEVar11 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)operator_new((long)pEVar11 << 5);
  *(DefinitionSymbol **)((long)pTVar7 + lVar12) = args;
  *(undefined8 *)((long)pTVar7 + lVar12 + 8) = 0;
  SVar4 = args_1->endLoc;
  pSVar1 = (SourceLocation *)((long)pTVar7 + lVar12 + 0x10);
  *pSVar1 = args_1->startLoc;
  pSVar1[1] = SVar4;
  pTVar10 = this->data_;
  pTVar8 = pTVar10 + this->len;
  pTVar9 = pTVar7;
  if (pTVar8 == pos) {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      pDVar5 = pTVar10->definition;
      pCVar6 = pTVar10->rule;
      SVar4 = (pTVar10->sourceRange).endLoc;
      (pTVar9->sourceRange).startLoc = (pTVar10->sourceRange).startLoc;
      (pTVar9->sourceRange).endLoc = SVar4;
      pTVar9->definition = pDVar5;
      pTVar9->rule = pCVar6;
      pTVar9 = pTVar9 + 1;
    }
  }
  else {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      pDVar5 = pTVar10->definition;
      pCVar6 = pTVar10->rule;
      SVar4 = (pTVar10->sourceRange).endLoc;
      (pTVar9->sourceRange).startLoc = (pTVar10->sourceRange).startLoc;
      (pTVar9->sourceRange).endLoc = SVar4;
      pTVar9->definition = pDVar5;
      pTVar9->rule = pCVar6;
      pTVar9 = pTVar9 + 1;
    }
    puVar3 = (undefined8 *)((long)pTVar7 + lVar12);
    for (; pos != pTVar8; pos = pos + 1) {
      pDVar5 = pos->definition;
      pCVar6 = pos->rule;
      SVar4 = (pos->sourceRange).endLoc;
      *(SourceLocation *)(puVar3 + 6) = (pos->sourceRange).startLoc;
      *(SourceLocation *)(puVar3 + 7) = SVar4;
      puVar3[4] = pDVar5;
      puVar3[5] = pCVar6;
      puVar3 = puVar3 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pTVar7;
  return (pointer)((long)pTVar7 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}